

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_swap(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  ts = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ts_00 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  arg1 = s_00->cpu_dregs[insn & 7];
  tcg_gen_shli_i32_m68k(s_00,(TCGv_i32)((long)ts - (long)s_00),arg1,0x10);
  tcg_gen_shri_i32_m68k(s_00,(TCGv_i32)((long)ts_00 - (long)s_00),arg1,0x10);
  tcg_gen_op3_m68k(s_00,INDEX_op_or_i32,(TCGArg)(arg1 + (long)&s_00->pool_cur),(TCGArg)ts,
                   (TCGArg)ts_00);
  tcg_temp_free_internal_m68k(s_00,ts_00);
  tcg_temp_free_internal_m68k(s_00,ts);
  gen_logic_cc(s,arg1,2);
  return;
}

Assistant:

DISAS_INSN(swap)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv src2;
    TCGv reg;

    src1 = tcg_temp_new(tcg_ctx);
    src2 = tcg_temp_new(tcg_ctx);
    reg = DREG(insn, 0);
    tcg_gen_shli_i32(tcg_ctx, src1, reg, 16);
    tcg_gen_shri_i32(tcg_ctx, src2, reg, 16);
    tcg_gen_or_i32(tcg_ctx, reg, src1, src2);
    tcg_temp_free(tcg_ctx, src2);
    tcg_temp_free(tcg_ctx, src1);
    gen_logic_cc(s, reg, OS_LONG);
}